

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::ModeFunction<duckdb::ModeStandard<long>>::
     Finalize<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>>
               (ModeState<long,_duckdb::ModeStandard<long>_> *state,long *target,
               AggregateFinalizeData *finalize_data)

{
  const_iterator cVar1;
  
  if (state->frequency_map != (Counts *)0x0) {
    cVar1 = ModeState<long,_duckdb::ModeStandard<long>_>::Scan(state);
    if (cVar1.super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>._M_cur !=
        (__node_type *)0x0) {
      *target = *(long *)((long)cVar1.
                                super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>
                                ._M_cur + 8);
      return;
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			target = TYPE_OP::template Assign<T, T>(finalize_data.result, highest_frequency->first);
		} else {
			finalize_data.ReturnNull();
		}
	}